

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O2

AudioBackend_Sound * AudioBackend_CreateSound(uint frequency,size_t frames)

{
  AudioBackend_Sound *sound;
  uchar *puVar1;
  ma_context *pmVar2;
  
  sound = (AudioBackend_Sound *)malloc(0x48);
  if (sound != (AudioBackend_Sound *)0x0) {
    puVar1 = (uchar *)malloc(frames + 1);
    sound->samples = puVar1;
    if (puVar1 != (uchar *)0x0) {
      sound->frames = frames;
      sound->playing = false;
      sound->position = 0.0;
      sound->frequency = frequency;
      sound->advance_delta = (double)frequency / (double)(long)output_frequency;
      SetSoundVolume(sound,0);
      SetSoundPan(sound,0);
      pmVar2 = (ma_context *)0x0;
      if (mutex.pContext != (ma_context *)0x0) {
        (*((mutex.pContext)->field_22).posix.pthread_mutex_lock)(0x127828);
        pmVar2 = mutex.pContext;
      }
      sound->next = sound_list_head;
      if (pmVar2 == (ma_context *)0x0) {
        sound_list_head = sound;
        return sound;
      }
      sound_list_head = sound;
      (*(pmVar2->field_22).posix.pthread_mutex_unlock)(0x127828);
      return sound;
    }
    free(sound);
  }
  return (AudioBackend_Sound *)0x0;
}

Assistant:

AudioBackend_Sound* AudioBackend_CreateSound(unsigned int frequency, size_t frames)
{
	AudioBackend_Sound *sound = (AudioBackend_Sound*)malloc(sizeof(AudioBackend_Sound));

	if (sound == NULL)
		return NULL;

	sound->samples = (unsigned char*)malloc(frames + 1);

	if (sound->samples == NULL)
	{
		free(sound);
		return NULL;
	}

	sound->frames = frames;
	sound->playing = FALSE;
	sound->position = 0.0;

	SetSoundFrequency(sound, frequency);
	SetSoundVolume(sound, 0);
	SetSoundPan(sound, 0);

	ma_mutex_lock(&mutex);

	sound->next = sound_list_head;
	sound_list_head = sound;

	ma_mutex_unlock(&mutex);

	return sound;
}